

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_table.c
# Opt level: O0

HashEntry * raviX_hash_table_insert_pre_hashed(HashTable *ht,uint32_t hash,void *key,void *data)

{
  int iVar1;
  HashEntry *entry_00;
  uint uVar2;
  uint32_t double_hash;
  HashEntry *entry;
  HashEntry *available_entry;
  uint32_t hash_address;
  uint32_t start_hash_address;
  void *data_local;
  void *key_local;
  uint32_t hash_local;
  HashTable *ht_local;
  
  entry = (HashEntry *)0x0;
  if (ht->entries < ht->max_entries) {
    if (ht->max_entries <= ht->deleted_entries + ht->entries) {
      hash_table_rehash(ht,ht->size_index);
    }
  }
  else {
    hash_table_rehash(ht,ht->size_index + 1);
  }
  uVar2 = hash % ht->size;
  available_entry._0_4_ = uVar2;
  do {
    entry_00 = ht->table + (uint)available_entry;
    iVar1 = entry_is_present(entry_00);
    if (iVar1 == 0) {
      if (entry == (HashEntry *)0x0) {
        entry = entry_00;
      }
      iVar1 = entry_is_free(entry_00);
      if (iVar1 != 0) break;
    }
    iVar1 = entry_is_deleted(entry_00);
    if (((iVar1 == 0) && (entry_00->hash == hash)) &&
       (iVar1 = (*ht->key_equals_function)(key,entry_00->key), iVar1 != 0)) {
      entry_00->key = key;
      entry_00->data = data;
      return entry_00;
    }
    available_entry._0_4_ = ((uint)available_entry + hash % ht->rehash + 1) % ht->size;
  } while ((uint)available_entry != uVar2);
  if (entry == (HashEntry *)0x0) {
    ht_local = (HashTable *)0x0;
  }
  else {
    iVar1 = entry_is_deleted(entry);
    if (iVar1 != 0) {
      ht->deleted_entries = ht->deleted_entries - 1;
    }
    entry->hash = hash;
    entry->key = key;
    entry->data = data;
    ht->entries = ht->entries + 1;
    ht_local = (HashTable *)entry;
  }
  return (HashEntry *)ht_local;
}

Assistant:

HashEntry *
raviX_hash_table_insert_pre_hashed(HashTable *ht, uint32_t hash,
			     const void *key, void *data)
{
	uint32_t start_hash_address, hash_address;
	HashEntry *available_entry = NULL;

	if (ht->entries >= ht->max_entries) {
		hash_table_rehash(ht, ht->size_index + 1);
	} else if (ht->deleted_entries + ht->entries >= ht->max_entries) {
		hash_table_rehash(ht, ht->size_index);
	}

	start_hash_address = hash % ht->size;
	hash_address = start_hash_address;
	do {
		HashEntry *entry = ht->table + hash_address;
		uint32_t double_hash;

		if (!entry_is_present(entry)) {
			/* Stash the first available entry we find */
			if (available_entry == NULL)
				available_entry = entry;
			if (entry_is_free(entry))
				break;
		}

		/* Implement replacement when another insert happens
		 * with a matching key.  This is a relatively common
		 * feature of hash tables, with the alternative
		 * generally being "insert the new value as well, and
		 * return it first when the key is searched for".
		 *
		 * Note that the hash table doesn't have a delete
		 * callback.  If freeing of old data pointers is
		 * required to avoid memory leaks, perform a search
		 * before inserting.
		 */
		if (!entry_is_deleted(entry) &&
		    entry->hash == hash &&
		    ht->key_equals_function(key, entry->key)) {
			entry->key = key;
			entry->data = data;
			return entry;
		}


		double_hash = 1 + hash % ht->rehash;

		hash_address = (hash_address + double_hash) % ht->size;
	} while (hash_address != start_hash_address);

	if (available_entry) {
		if (entry_is_deleted(available_entry))
			ht->deleted_entries--;
		available_entry->hash = hash;
		available_entry->key = key;
		available_entry->data = data;
		ht->entries++;
		return available_entry;
	}

	/* We could hit here if a required resize failed. An unchecked-malloc
	 * application could ignore this result.
	 */
	return NULL;
}